

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

Generator * kratos::create_wrapper_flatten(Generator *top,string *wrapper_name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  size_t *port_name;
  pointer puVar1;
  uint *puVar2;
  int iVar3;
  Generator *this_00;
  Param *pPVar4;
  _Base_ptr p_Var5;
  Port *pPVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  InternalException *this_01;
  uint *s;
  uint *puVar7;
  ulong uVar8;
  string *psVar9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  undefined8 uVar10;
  basic_string_view<char> bVar11;
  string_view format_str;
  format_args args;
  string local_158;
  undefined1 local_138 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
  params;
  string name;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  slices;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c8;
  shared_ptr<kratos::Stmt> local_c0;
  shared_ptr<kratos::Stmt> local_b0;
  shared_ptr<kratos::Stmt> local_a0;
  pointer local_90;
  _Base_ptr local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  Generator *local_70;
  undefined1 local_68 [8];
  shared_ptr<kratos::Port> p;
  string sStack_50;
  Var *var;
  
  this_00 = Context::generator(top->context_,wrapper_name);
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_138,
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
             &top->super_enable_shared_from_this<kratos::Generator>);
  sStack_50.field_2._8_8_ = this_00;
  Generator::add_child_generator
            (this_00,&top->instance_name,(shared_ptr<kratos::Generator> *)local_138);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&params);
  local_70 = top;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
              *)local_138,&(top->params_)._M_t);
  this = &p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  for (p_Var5 = params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 != (_Rb_tree_node_base *)&params; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5))
  {
    pPVar4 = Generator::parameter((Generator *)sStack_50.field_2._8_8_,(string *)(p_Var5 + 1),0x20);
    (*(pPVar4->super_Const).super_Var.super_IRNode._vptr_IRNode[0x2b])
              (pPVar4,*(undefined8 *)(*(long *)(p_Var5 + 2) + 0x270));
    pPVar4 = *(Param **)(p_Var5 + 2);
    Var::as<kratos::Param>((Var *)this);
    Param::set_value(pPVar4,(shared_ptr<kratos::Param> *)this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sStack_50);
  }
  p_Var5 = (local_70->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_78 = &(local_70->ports_)._M_t._M_impl.super__Rb_tree_header._M_header;
  port_name = &params._M_t._M_impl.super__Rb_tree_header._M_node_count;
  do {
    if (p_Var5 == local_78) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
                   *)local_138);
      return (Generator *)sStack_50.field_2._8_8_;
    }
    local_88 = p_Var5 + 1;
    local_80 = p_Var5;
    Generator::get_port((Generator *)local_68,(string *)local_70);
    puVar1 = (((Var *)local_68)->size_).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((long)(((Var *)local_68)->size_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)puVar1 == 4) && (*puVar1 == 1)) {
      pPVar6 = Generator::port((Generator *)sStack_50.field_2._8_8_,(Port *)local_68,true);
      if (*(PortDirection *)((long)local_68 + 0x270) == In) {
        Var::assign((Var *)&p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(Var *)local_68,(AssignmentType)pPVar6);
        slices.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi;
        _Stack_c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_50._M_dataplus._M_p
        ;
        p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        sStack_50._M_dataplus._M_p = (pointer)0x0;
        Generator::add_stmt((Generator *)sStack_50.field_2._8_8_,
                            (shared_ptr<kratos::Stmt> *)
                            &slices.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_c8);
        psVar9 = &sStack_50;
      }
      else {
        std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Port,void>
                  ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)port_name,
                   (__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_68);
        Var::assign((Var *)&p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(shared_ptr<kratos::Var> *)pPVar6,(AssignmentType)port_name)
        ;
        local_c0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        local_c0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_50._M_dataplus._M_p;
        p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        sStack_50._M_dataplus._M_p = (pointer)0x0;
        Generator::add_stmt((Generator *)sStack_50.field_2._8_8_,&local_c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_c0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sStack_50);
        psVar9 = &name;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)psVar9);
      copy_attrs((Var *)local_68,&pPVar6->super_Var);
    }
    else {
      get_flatten_slices((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          *)((long)&name.field_2 + 8),(Var *)local_68);
      local_90 = slices.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      for (uVar10 = name.field_2._8_8_; (pointer)uVar10 != local_90; uVar10 = uVar10 + 0x18) {
        std::__cxx11::string::string((string *)port_name,(string *)local_88);
        puVar2 = (((pointer)uVar10)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (puVar7 = (((pointer)uVar10)->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_start; puVar7 != puVar2; puVar7 = puVar7 + 1) {
          sStack_50._M_string_length = (size_type)*puVar7;
          p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               params._M_t._M_impl.super__Rb_tree_header._M_node_count;
          sStack_50._M_dataplus._M_p = name._M_dataplus._M_p;
          bVar11 = fmt::v7::to_string_view<char,_0>("{0}_{1}");
          format_str.data_ = (char *)bVar11.size_;
          format_str.size_ = 0x2d;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)
                   &p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          fmt::v7::detail::vformat_abi_cxx11_(&local_158,(detail *)bVar11.data_,format_str,args);
          std::__cxx11::string::operator=((string *)port_name,(string *)&local_158);
          std::__cxx11::string::~string((string *)&local_158);
        }
        iVar3 = (*(((Var *)local_68)->super_IRNode)._vptr_IRNode[9])
                          (local_68,(ulong)*(((pointer)uVar10)->
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            )._M_impl.super__Vector_impl_data._M_start);
        var = (Var *)CONCAT44(extraout_var,iVar3);
        uVar8 = 1;
        while( true ) {
          puVar1 = (((pointer)uVar10)->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(((pointer)uVar10)->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish - (long)puVar1 >> 2) <= uVar8) break;
          iVar3 = (*(var->super_IRNode)._vptr_IRNode[9])(var,(ulong)puVar1[uVar8]);
          var = (Var *)CONCAT44(extraout_var_00,iVar3);
          uVar8 = uVar8 + 1;
        }
        puVar1 = (var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (((long)(var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 != 4) || (*puVar1 != 1))
        {
          this_01 = (InternalException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     &p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     "Unable to slice ports when flattening",(allocator<char> *)&local_158);
          InternalException::InternalException
                    (this_01,(string *)
                             &p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
          __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        pPVar6 = Generator::port((Generator *)sStack_50.field_2._8_8_,
                                 *(PortDirection *)((long)local_68 + 0x270),(string *)port_name,
                                 var->var_width_);
        if (*(PortDirection *)((long)local_68 + 0x270) == In) {
          Var::assign((Var *)&p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,var,(AssignmentType)pPVar6);
          local_b0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          local_b0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_50._M_dataplus._M_p;
          p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          sStack_50._M_dataplus._M_p = (pointer)0x0;
          Generator::add_stmt((Generator *)sStack_50.field_2._8_8_,&local_b0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_b0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          psVar9 = &sStack_50;
        }
        else {
          std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                    ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_158,
                     (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                     &var->super_enable_shared_from_this<kratos::Var>);
          Var::assign((Var *)&p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,(shared_ptr<kratos::Var> *)pPVar6,
                      (AssignmentType)&local_158);
          local_a0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          local_a0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_50._M_dataplus._M_p;
          p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          sStack_50._M_dataplus._M_p = (pointer)0x0;
          Generator::add_stmt((Generator *)sStack_50.field_2._8_8_,&local_a0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_a0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sStack_50);
          psVar9 = (string *)&local_158._M_string_length;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)psVar9);
        copy_attrs((Var *)local_68,&pPVar6->super_Var);
        std::__cxx11::string::~string((string *)port_name);
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)((long)&name.field_2 + 8));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(local_80);
  } while( true );
}

Assistant:

Generator& create_wrapper_flatten(Generator* top, const std::string& wrapper_name) {
    auto& gen = top->context()->generator(wrapper_name);
    gen.add_child_generator(top->instance_name, top->shared_from_this());
    // copy the parameter definition over
    auto params = top->get_params();
    for (auto const& [name, param] : params) {
        auto& new_p = gen.parameter(name, 32);
        new_p.set_value(param->value());
        param->set_value(new_p.as<Param>());
    }

    auto const& ports = top->get_port_names();
    for (auto const& port_name : ports) {
        auto p = top->get_port(port_name);
        if (p->size().size() == 1 && p->size()[0] == 1) {
            // this is a normal wire
            auto& new_port = gen.port(*p);
            if (p->port_direction() == PortDirection::In) {
                gen.add_stmt(p->assign(new_port, AssignmentType::Blocking));
            } else {
                gen.add_stmt(new_port.assign(p, AssignmentType::Blocking));
            }
            copy_attrs(*p, new_port);
        } else {
            // need to flatten the array
            auto slices = get_flatten_slices(p.get());
            // create port for them based on the slice
            for (auto const& slice : slices) {
                std::string name = port_name;
                for (auto const& s : slice) name = ::format("{0}_{1}", name, s);
                auto* slice_port = &(*p)[slice[0]];
                for (uint64_t i = 1; i < slice.size(); i++) slice_port = &(*slice_port)[slice[i]];
                if (slice_port->size().size() != 1 || slice_port->size()[0] != 1)
                    throw InternalException("Unable to slice ports when flattening");
                auto& new_port = gen.port(p->port_direction(), name, slice_port->var_width());
                if (p->port_direction() == PortDirection::In) {
                    gen.add_stmt(slice_port->assign(new_port, AssignmentType::Blocking));
                } else {
                    gen.add_stmt(
                        new_port.assign(slice_port->shared_from_this(), AssignmentType::Blocking));
                }
                copy_attrs(*p, new_port);
            }
        }
    }
    return gen;
}